

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ContainerUtilities.h
# Opt level: O0

bool soul::
     removeItem<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>,soul::heart::Function&>
               (ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL> *v,
               Function *itemToRemove)

{
  pool_ref<soul::heart::Function> *ppVar1;
  pool_ref<soul::heart::Function> *ppVar2;
  pool_ref<soul::heart::Function> *found;
  Function *itemToRemove_local;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL> *v_local;
  
  ppVar1 = std::begin<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>>(v);
  ppVar2 = std::end<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>>(v);
  ppVar1 = std::find<soul::pool_ref<soul::heart::Function>*,soul::heart::Function>
                     (ppVar1,ppVar2,itemToRemove);
  ppVar2 = std::end<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>>(v);
  if (ppVar1 != ppVar2) {
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL>::erase(v,ppVar1);
  }
  return ppVar1 != ppVar2;
}

Assistant:

inline bool removeItem (Vector& v, ItemType&& itemToRemove)
{
    auto found = std::find (std::begin (v), std::end (v), itemToRemove);

    if (found == std::end (v))
        return false;

    v.erase (found);
    return true;
}